

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O2

int fdsocket_outfd_find(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*bv <= *av) {
    uVar1 = (uint)(*bv < *av);
  }
  return uVar1;
}

Assistant:

static int fdsocket_outfd_find(void *av, void *bv)
{
    int a = *(int *)av;
    FdSocket *b = (FdSocket *)bv;
    if (a < b->outfd)
        return -1;
    if (a > b->outfd)
        return +1;
    return 0;
}